

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  boolean bVar2;
  j_decompress_ptr srcinfo_00;
  size_t sVar3;
  jvirt_barray_ptr *src_coef_arrays_00;
  jpeg_transform_info *info;
  FILE *__stream;
  undefined8 *in_RSI;
  int in_EDI;
  long icc_len;
  JOCTET *icc_profile;
  FILE *icc_file;
  FILE *fp;
  int file_index;
  jvirt_barray_ptr *dst_coef_arrays;
  jvirt_barray_ptr *src_coef_arrays;
  cdjpeg_progress_mgr dst_progress;
  cdjpeg_progress_mgr src_progress;
  jpeg_error_mgr jdsterr;
  jpeg_error_mgr jsrcerr;
  jpeg_compress_struct dstinfo;
  FILE *drop_file;
  jpeg_error_mgr jdroperr;
  jpeg_decompress_struct dropinfo;
  jpeg_decompress_struct srcinfo;
  JCOPY_OPTION in_stack_fffffffffffff64c;
  j_decompress_ptr srcinfo_01;
  j_compress_ptr dstinfo_00;
  j_decompress_ptr in_stack_fffffffffffff660;
  boolean in_stack_fffffffffffff688;
  int in_stack_fffffffffffff68c;
  j_decompress_ptr in_stack_fffffffffffff690;
  int in_stack_fffffffffffff69c;
  j_compress_ptr in_stack_fffffffffffff6a0;
  JDIMENSION in_stack_fffffffffffff6b0;
  boolean in_stack_fffffffffffff6b4;
  j_decompress_ptr in_stack_fffffffffffff6b8;
  cdjpeg_progress_mgr local_940;
  undefined1 local_908 [124];
  undefined4 local_88c;
  long local_888;
  undefined1 local_860 [8];
  code *local_858;
  undefined4 local_7e4;
  long local_7e0;
  jpeg_common_struct local_7b8 [13];
  FILE *local_5b0;
  undefined1 local_5a8 [128];
  long local_528;
  jpeg_decompress_struct local_500;
  jpeg_common_struct local_288 [15];
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  dstinfo_00 = (j_compress_ptr)0x0;
  srcinfo_01 = (j_decompress_ptr)0x0;
  progname = (char *)*in_RSI;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "jpegtran";
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_288[0].err = (jpeg_error_mgr *)jpeg_std_error(local_860);
  jpeg_CreateDecompress(local_288,0x3e,0x278);
  local_7b8[0].err = (jpeg_error_mgr *)jpeg_std_error(local_908);
  jpeg_CreateCompress(local_7b8,0x3e,0x208);
  iVar1 = parse_switches(in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
                         (char **)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                         in_stack_fffffffffffff688);
  local_7e4 = local_88c;
  (local_288[0].mem)->max_memory_to_use = (local_7b8[0].mem)->max_memory_to_use;
  if (strict != 0) {
    local_858 = my_emit_message;
  }
  if (iVar1 < local_8 + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
  }
  if (iVar1 < local_8) {
    srcinfo_00 = (j_decompress_ptr)fopen((char *)local_10[iVar1],"rb");
    if (srcinfo_00 == (j_decompress_ptr)0x0) {
      fprintf(_stderr,"%s: can\'t open %s for reading\n",progname,local_10[iVar1]);
      exit(1);
    }
  }
  else {
    srcinfo_00 = (j_decompress_ptr)read_stdin();
  }
  if (icc_filename != (char *)0x0) {
    in_stack_fffffffffffff660 = (j_decompress_ptr)fopen(icc_filename,"rb");
    if (in_stack_fffffffffffff660 == (j_decompress_ptr)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,icc_filename);
      exit(1);
    }
    iVar1 = fseek((FILE *)in_stack_fffffffffffff660,0,2);
    if (((iVar1 < 0) ||
        (srcinfo_01 = (j_decompress_ptr)ftell((FILE *)in_stack_fffffffffffff660),
        (long)srcinfo_01 < 1)) || (iVar1 = fseek((FILE *)in_stack_fffffffffffff660,0,0), iVar1 < 0))
    {
      fprintf(_stderr,"%s: can\'t determine size of %s\n",progname,icc_filename);
      exit(1);
    }
    dstinfo_00 = (j_compress_ptr)malloc((size_t)srcinfo_01);
    if (dstinfo_00 == (j_compress_ptr)0x0) {
      fprintf(_stderr,"%s: can\'t allocate memory for ICC profile\n",progname);
      fclose((FILE *)in_stack_fffffffffffff660);
      exit(1);
    }
    sVar3 = fread(dstinfo_00,(size_t)srcinfo_01,1,(FILE *)in_stack_fffffffffffff660);
    if (sVar3 == 0) {
      fprintf(_stderr,"%s: can\'t read ICC profile from %s\n",progname,icc_filename);
      free(dstinfo_00);
      fclose((FILE *)in_stack_fffffffffffff660);
      exit(1);
    }
    fclose((FILE *)in_stack_fffffffffffff660);
    if (copyoption == JCOPYOPT_ALL) {
      copyoption = JCOPYOPT_ALL_EXCEPT_ICC;
    }
    if (copyoption == JCOPYOPT_ICC) {
      copyoption = JCOPYOPT_NONE;
    }
  }
  if (report != 0) {
    start_progress_monitor(local_7b8,(cd_progress_ptr)&stack0xfffffffffffff688);
    in_stack_fffffffffffff6b4 = report;
  }
  if ((report != 0) || (max_scans != 0)) {
    start_progress_monitor(local_288,&local_940);
    local_940.report = report;
    local_940.max_scans = max_scans;
  }
  if (dropfilename == (char *)0x0) {
    local_5b0 = (FILE *)0x0;
  }
  else {
    local_5b0 = fopen(dropfilename,"rb");
    if (local_5b0 == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s for reading\n",progname,dropfilename);
      exit(1);
    }
    local_500.err = (jpeg_error_mgr *)jpeg_std_error(local_5a8);
    jpeg_CreateDecompress(&local_500,0x3e,0x278);
    jpeg_stdio_src(&local_500,local_5b0);
  }
  jpeg_stdio_src(local_288,srcinfo_00);
  jcopy_markers_setup(srcinfo_01,in_stack_fffffffffffff64c);
  jpeg_read_header(local_288,1);
  if (dropfilename != (char *)0x0) {
    jpeg_read_header(&local_500,1);
    transformoption.crop_width = local_500.image_width;
    transformoption.crop_width_set = JCROP_POS;
    transformoption.crop_height = local_500.image_height;
    transformoption.crop_height_set = JCROP_POS;
    transformoption.drop_ptr = &local_500;
  }
  bVar2 = jtransform_request_workspace
                    (in_stack_fffffffffffff6b8,
                     (jpeg_transform_info *)
                     CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
  if (bVar2 == 0) {
    fprintf(_stderr,"%s: transformation is not perfect\n",progname);
    exit(1);
  }
  src_coef_arrays_00 = (jvirt_barray_ptr *)jpeg_read_coefficients(local_288);
  if (dropfilename != (char *)0x0) {
    transformoption.drop_coef_arrays = (jvirt_barray_ptr *)jpeg_read_coefficients(&local_500);
  }
  jpeg_copy_critical_parameters(local_288,local_7b8);
  info = (jpeg_transform_info *)
         jtransform_adjust_parameters
                   (srcinfo_00,(j_compress_ptr)in_stack_fffffffffffff660,
                    (jvirt_barray_ptr *)dstinfo_00,(jpeg_transform_info *)srcinfo_01);
  if (srcinfo_00 != _stdin) {
    fclose((FILE *)srcinfo_00);
  }
  if (outfilename == (char *)0x0) {
    __stream = (FILE *)write_stdout();
  }
  else {
    __stream = fopen(outfilename,"wb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s for writing\n",progname,outfilename);
      exit(1);
    }
  }
  parse_switches(in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c,
                 (char **)in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
                 in_stack_fffffffffffff688);
  jpeg_stdio_dest(local_7b8,__stream);
  jpeg_write_coefficients(local_7b8,info);
  jcopy_markers_execute
            (in_stack_fffffffffffff660,dstinfo_00,(JCOPY_OPTION)((ulong)srcinfo_01 >> 0x20));
  if (dstinfo_00 != (j_compress_ptr)0x0) {
    jpeg_write_icc_profile(local_7b8,dstinfo_00,(ulong)srcinfo_01 & 0xffffffff);
  }
  jtransform_execute_transform
            (in_stack_fffffffffffff690,
             (j_compress_ptr)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
             src_coef_arrays_00,info);
  jpeg_finish_compress(local_7b8);
  jpeg_destroy_compress(local_7b8);
  if (dropfilename != (char *)0x0) {
    jpeg_finish_decompress(&local_500);
    jpeg_destroy_decompress(&local_500);
  }
  jpeg_finish_decompress(local_288);
  jpeg_destroy_decompress(local_288);
  if (__stream != _stdout) {
    fclose(__stream);
  }
  if (local_5b0 != (FILE *)0x0) {
    fclose(local_5b0);
  }
  if (report != 0) {
    end_progress_monitor((j_common_ptr)0x102b3b);
  }
  if ((report != 0) || (max_scans != 0)) {
    end_progress_monitor((j_common_ptr)0x102b5a);
  }
  free(dstinfo_00);
  if (dropfilename == (char *)0x0) {
    iVar1 = 0;
    if (local_7e0 + local_888 != 0) {
      iVar1 = 2;
    }
    exit(iVar1);
  }
  iVar1 = 0;
  if (local_7e0 + local_528 + local_888 != 0) {
    iVar1 = 2;
  }
  exit(iVar1);
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_decompress_struct srcinfo;
#if TRANSFORMS_SUPPORTED
  struct jpeg_decompress_struct dropinfo;
  struct jpeg_error_mgr jdroperr;
  FILE *drop_file;
#endif
  struct jpeg_compress_struct dstinfo;
  struct jpeg_error_mgr jsrcerr, jdsterr;
  struct cdjpeg_progress_mgr src_progress, dst_progress;
  jvirt_barray_ptr *src_coef_arrays;
  jvirt_barray_ptr *dst_coef_arrays;
  int file_index;
  /* We assume all-in-memory processing and can therefore use only a
   * single file pointer for sequential input and output operation.
   */
  FILE *fp;
  FILE *icc_file;
  JOCTET *icc_profile = NULL;
  long icc_len = 0;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "jpegtran";      /* in case C library doesn't provide it */

  /* Initialize the JPEG decompression object with default error handling. */
  srcinfo.err = jpeg_std_error(&jsrcerr);
  jpeg_create_decompress(&srcinfo);
  /* Initialize the JPEG compression object with default error handling. */
  dstinfo.err = jpeg_std_error(&jdsterr);
  jpeg_create_compress(&dstinfo);

  /* Scan command line to find file names.
   * It is convenient to use just one switch-parsing routine, but the switch
   * values read here are mostly ignored; we will rescan the switches after
   * opening the input file.  Also note that most of the switches affect the
   * destination JPEG object, so we parse into that and then copy over what
   * needs to affect the source too.
   */

  file_index = parse_switches(&dstinfo, argc, argv, 0, FALSE);
  jsrcerr.trace_level = jdsterr.trace_level;
  srcinfo.mem->max_memory_to_use = dstinfo.mem->max_memory_to_use;

  if (strict)
    jsrcerr.emit_message = my_emit_message;

#ifdef TWO_FILE_COMMANDLINE
  /* Must have either -outfile switch or explicit output file name */
  if (outfilename == NULL) {
    if (file_index != argc - 2) {
      fprintf(stderr, "%s: must name one input and one output file\n",
              progname);
      usage();
    }
    outfilename = argv[file_index + 1];
  } else {
    if (file_index != argc - 1) {
      fprintf(stderr, "%s: must name one input and one output file\n",
              progname);
      usage();
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((fp = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s for reading\n", progname,
              argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    fp = read_stdin();
  }

  if (icc_filename != NULL) {
    if ((icc_file = fopen(icc_filename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (fseek(icc_file, 0, SEEK_END) < 0 ||
        (icc_len = ftell(icc_file)) < 1 ||
        fseek(icc_file, 0, SEEK_SET) < 0) {
      fprintf(stderr, "%s: can't determine size of %s\n", progname,
              icc_filename);
      exit(EXIT_FAILURE);
    }
    if ((icc_profile = (JOCTET *)malloc(icc_len)) == NULL) {
      fprintf(stderr, "%s: can't allocate memory for ICC profile\n", progname);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    if (fread(icc_profile, icc_len, 1, icc_file) < 1) {
      fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
              icc_filename);
      free(icc_profile);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    fclose(icc_file);
    if (copyoption == JCOPYOPT_ALL)
      copyoption = JCOPYOPT_ALL_EXCEPT_ICC;
    if (copyoption == JCOPYOPT_ICC)
      copyoption = JCOPYOPT_NONE;
  }

  if (report) {
    start_progress_monitor((j_common_ptr)&dstinfo, &dst_progress);
    dst_progress.report = report;
  }
  if (report || max_scans != 0) {
    start_progress_monitor((j_common_ptr)&srcinfo, &src_progress);
    src_progress.report = report;
    src_progress.max_scans = max_scans;
  }
#if TRANSFORMS_SUPPORTED
  /* Open the drop file. */
  if (dropfilename != NULL) {
    if ((drop_file = fopen(dropfilename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s for reading\n", progname,
              dropfilename);
      exit(EXIT_FAILURE);
    }
    dropinfo.err = jpeg_std_error(&jdroperr);
    jpeg_create_decompress(&dropinfo);
    jpeg_stdio_src(&dropinfo, drop_file);
  } else {
    drop_file = NULL;
  }
#endif

  /* Specify data source for decompression */
  jpeg_stdio_src(&srcinfo, fp);

  /* Enable saving of extra markers that we want to copy */
  jcopy_markers_setup(&srcinfo, copyoption);

  /* Read file header */
  (void)jpeg_read_header(&srcinfo, TRUE);

#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL) {
    (void)jpeg_read_header(&dropinfo, TRUE);
    transformoption.crop_width = dropinfo.image_width;
    transformoption.crop_width_set = JCROP_POS;
    transformoption.crop_height = dropinfo.image_height;
    transformoption.crop_height_set = JCROP_POS;
    transformoption.drop_ptr = &dropinfo;
  }
#endif

  /* Any space needed by a transform option must be requested before
   * jpeg_read_coefficients so that memory allocation will be done right.
   */
#if TRANSFORMS_SUPPORTED
  /* Fail right away if -perfect is given and transformation is not perfect.
   */
  if (!jtransform_request_workspace(&srcinfo, &transformoption)) {
    fprintf(stderr, "%s: transformation is not perfect\n", progname);
    exit(EXIT_FAILURE);
  }
#endif

  /* Read source file as DCT coefficients */
  src_coef_arrays = jpeg_read_coefficients(&srcinfo);

#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL) {
    transformoption.drop_coef_arrays = jpeg_read_coefficients(&dropinfo);
  }
#endif

  /* Initialize destination compression parameters from source values */
  jpeg_copy_critical_parameters(&srcinfo, &dstinfo);

  /* Adjust destination parameters if required by transform options;
   * also find out which set of coefficient arrays will hold the output.
   */
#if TRANSFORMS_SUPPORTED
  dst_coef_arrays = jtransform_adjust_parameters(&srcinfo, &dstinfo,
                                                 src_coef_arrays,
                                                 &transformoption);
#else
  dst_coef_arrays = src_coef_arrays;
#endif

  /* Close input file, if we opened it.
   * Note: we assume that jpeg_read_coefficients consumed all input
   * until JPEG_REACHED_EOI, and that jpeg_finish_decompress will
   * only consume more while (!cinfo->inputctl->eoi_reached).
   * We cannot call jpeg_finish_decompress here since we still need the
   * virtual arrays allocated from the source object for processing.
   */
  if (fp != stdin)
    fclose(fp);

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((fp = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s for writing\n", progname,
              outfilename);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default output file is stdout */
    fp = write_stdout();
  }

  /* Adjust default compression parameters by re-parsing the options */
  file_index = parse_switches(&dstinfo, argc, argv, 0, TRUE);

  /* Specify data destination for compression */
  jpeg_stdio_dest(&dstinfo, fp);

  /* Start compressor (note no image data is actually written here) */
  jpeg_write_coefficients(&dstinfo, dst_coef_arrays);

  /* Copy to the output file any extra markers that we want to preserve */
  jcopy_markers_execute(&srcinfo, &dstinfo, copyoption);

  if (icc_profile != NULL)
    jpeg_write_icc_profile(&dstinfo, icc_profile, (unsigned int)icc_len);

  /* Execute image transformation, if any */
#if TRANSFORMS_SUPPORTED
  jtransform_execute_transformation(&srcinfo, &dstinfo, src_coef_arrays,
                                    &transformoption);
#endif

  /* Finish compression and release memory */
  jpeg_finish_compress(&dstinfo);
  jpeg_destroy_compress(&dstinfo);
#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL) {
    (void)jpeg_finish_decompress(&dropinfo);
    jpeg_destroy_decompress(&dropinfo);
  }
#endif
  (void)jpeg_finish_decompress(&srcinfo);
  jpeg_destroy_decompress(&srcinfo);

  /* Close output file, if we opened it */
  if (fp != stdout)
    fclose(fp);
#if TRANSFORMS_SUPPORTED
  if (drop_file != NULL)
    fclose(drop_file);
#endif

  if (report)
    end_progress_monitor((j_common_ptr)&dstinfo);
  if (report || max_scans != 0)
    end_progress_monitor((j_common_ptr)&srcinfo);

  free(icc_profile);

  /* All done. */
#if TRANSFORMS_SUPPORTED
  if (dropfilename != NULL)
    exit(jsrcerr.num_warnings + jdroperr.num_warnings +
         jdsterr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
#endif
  exit(jsrcerr.num_warnings + jdsterr.num_warnings ?
       EXIT_WARNING : EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}